

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O0

void __thiscall
InlineTable_WithBareKey_Test::~InlineTable_WithBareKey_Test(InlineTable_WithBareKey_Test *this)

{
  InlineTable_WithBareKey_Test *this_local;
  
  ~InlineTable_WithBareKey_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(InlineTable, WithBareKey) {
    std::istringstream input("key = {key=123} ");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_inline_table},
        {sax_event_t::key, "key"},
        {sax_event_t::integer, 123},
        {sax_event_t::finish_inline_table, 1},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}